

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesTemperatureGetConfig(zes_temp_handle_t hTemperature,zes_temp_config_t *pConfig)

{
  zes_pfnTemperatureGetConfig_t pfnGetConfig;
  dditable_t *dditable;
  ze_result_t result;
  zes_temp_config_t *pConfig_local;
  zes_temp_handle_t hTemperature_local;
  
  if (*(code **)(*(long *)(hTemperature + 8) + 0xc20) == (code *)0x0) {
    hTemperature_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hTemperature_local._4_4_ =
         (**(code **)(*(long *)(hTemperature + 8) + 0xc20))(*(undefined8 *)hTemperature,pConfig);
  }
  return hTemperature_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesTemperatureGetConfig(
        zes_temp_handle_t hTemperature,                 ///< [in] Handle for the component.
        zes_temp_config_t* pConfig                      ///< [in,out] Returns current configuration.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_temp_object_t*>( hTemperature )->dditable;
        auto pfnGetConfig = dditable->zes.Temperature.pfnGetConfig;
        if( nullptr == pfnGetConfig )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hTemperature = reinterpret_cast<zes_temp_object_t*>( hTemperature )->handle;

        // forward to device-driver
        result = pfnGetConfig( hTemperature, pConfig );

        return result;
    }